

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
CEPlanet::PositionICRS_Obs
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,CEPlanet *this,
          CEDate *date)

{
  double dVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  CEPlanet past;
  double local_158;
  CEPlanet local_150;
  
  CEPlanet(&local_150,this);
  local_158 = CEDate::operator_cast_to_double(date);
  UpdatePosition(&local_150,&local_158);
  dVar1 = EarthDist_AU(&local_150,date);
  dVar2 = CppEphem::c_au_per_day();
  (*date->_vptr_CEDate[4])(date);
  local_158 = extraout_XMM0_Qa - dVar1 / dVar2;
  UpdatePosition(&local_150,&local_158);
  PositionICRS(__return_storage_ptr__,&local_150);
  ~CEPlanet(&local_150);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> CEPlanet::PositionICRS_Obs(const CEDate& date) const
{
    // Make a copy of the planet so we dont need to reset values
    CEPlanet past(*this);
    past.UpdatePosition(date);

    // Compute the light travel-time delay
    double earth_dist = past.EarthDist_AU(date);
    double delay      = earth_dist / CppEphem::c_au_per_day();

    // Return the positions as observed
    past.UpdatePosition(date.JD() - delay);
    return past.PositionICRS();
}